

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::globaltype<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  Type *pTVar2;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Ok local_102;
  allocator<char> local_101;
  string local_100;
  Err local_e0;
  uint local_bc;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  Result<wasm::Type> _val;
  Result<wasm::Type> type;
  Mutability local_1c;
  Mutability mutability;
  ParseDefsCtx *ctx_local;
  
  expected = sv("mut",3);
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  local_1c = (Mutability)bVar1;
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20);
  valtype<wasm::WATParser::ParseDefsCtx>((Result<wasm::Type> *)__return_storage_ptr___00,ctx);
  Result<wasm::Type>::Result
            ((Result<wasm::Type> *)local_80,(Result<wasm::Type> *)__return_storage_ptr___00);
  local_98 = Result<wasm::Type>::getErr((Result<wasm::Type> *)local_80);
  bVar1 = local_98 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_b8,local_98);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
    wasm::Err::~Err(&local_b8);
  }
  local_bc = (uint)bVar1;
  Result<wasm::Type>::~Result((Result<wasm::Type> *)local_80);
  if (local_bc == 0) {
    if ((local_1c != Mutable) || (bVar1 = Lexer::takeRParen(&ctx->in), bVar1)) {
      pTVar2 = Result<wasm::Type>::operator*
                         ((Result<wasm::Type> *)
                          ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      ParseDefsCtx::makeGlobalType(ctx,local_1c,(TypeT)pTVar2->id);
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_102);
      local_bc = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"expected end of globaltype",&local_101);
      Lexer::err(&local_e0,&ctx->in,&local_100);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_e0);
      wasm::Err::~Err(&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      local_bc = 1;
    }
  }
  Result<wasm::Type>::~Result
            ((Result<wasm::Type> *)
             ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::GlobalTypeT> globaltype(Ctx& ctx) {
  auto mutability = Immutable;
  if (ctx.in.takeSExprStart("mut"sv)) {
    mutability = Mutable;
  }

  auto type = valtype(ctx);
  CHECK_ERR(type);

  if (mutability == Mutable && !ctx.in.takeRParen()) {
    return ctx.in.err("expected end of globaltype");
  }

  return ctx.makeGlobalType(mutability, *type);
}